

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalman_filter.cpp
# Opt level: O2

void __thiscall KalmanFilter::~KalmanFilter(KalmanFilter *this)

{
  this->_vptr_KalmanFilter = (_func_int **)&PTR__KalmanFilter_0011ed48;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->R_);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->H_);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->Q_);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->F_);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->P_);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->x_);
  return;
}

Assistant:

KalmanFilter::~KalmanFilter() {}